

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixPic.cpp
# Opt level: O2

HighsStatus
writeRmatrixPicToFile
          (HighsOptions *options,string *fileprefix,HighsInt numRow,HighsInt numCol,
          vector<int,_std::allocator<int>_> *ARstart,vector<int,_std::allocator<int>_> *ARindex)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  uint uVar5;
  HighsStatus HVar6;
  ostream *poVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  HighsInt pixel;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  vector<int,_std::allocator<int>_> value;
  value_type_conflict2 local_254;
  string filename;
  ofstream f;
  
  bVar4 = std::operator==(fileprefix,"");
  if (bVar4) {
    HVar6 = kError;
  }
  else {
    std::operator+(&filename,fileprefix,".pbm");
    std::ofstream::ofstream(&f);
    std::ofstream::open((string *)&f,(_Ios_Openmode)&filename);
    uVar16 = 1;
    uVar8 = uVar16;
    if (0x63e < numCol) {
      uVar8 = (uint)numCol / 0x63e + (uint)(((uint)numCol / 0x63e) * 0x63e < (uint)numCol);
    }
    if (0x382 < numRow) {
      uVar16 = (uint)numRow / 0x382 + (uint)(((uint)numRow / 0x382) * 0x382 < (uint)numRow);
    }
    if (uVar16 < uVar8) {
      uVar16 = uVar8;
    }
    iVar13 = numCol / (int)uVar16;
    uVar8 = (uint)((int)(uVar16 * iVar13) < numCol);
    uVar15 = iVar13 + uVar8 + 2;
    uVar5 = numRow / (int)uVar16 + (uint)((int)((numRow / (int)uVar16) * uVar16) < numRow) + 2;
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
                 "Representing LP constraint matrix sparsity pattern %dx%d .pbm file, mapping entries in square of size %d onto one pixel\n"
                 ,(ulong)uVar15,(ulong)uVar5,(ulong)uVar16);
    value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_254 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&value,(long)(int)uVar15,&local_254);
    poVar7 = std::operator<<((ostream *)&f,"P1");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = (ostream *)std::ostream::operator<<(&f,uVar15);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
    std::endl<char,std::char_traits<char>>(poVar7);
    uVar8 = iVar13 + uVar8;
    uVar5 = 0;
    if (0 < (int)uVar15) {
      uVar5 = uVar15;
    }
    uVar15 = uVar5;
    while (bVar4 = uVar15 != 0, uVar15 = uVar15 - 1, bVar4) {
      std::operator<<((ostream *)&f,"1 ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&f);
    uVar10 = 0;
    uVar14 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar14 = uVar10;
    }
    do {
      uVar15 = (int)uVar10 + uVar16;
      lVar9 = (long)(int)uVar10;
      uVar8 = numRow;
      if ((int)uVar15 < numRow) {
        uVar8 = uVar15;
      }
      uVar10 = (ulong)uVar8;
      piVar2 = (ARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      while (lVar9 < (int)uVar8) {
        piVar1 = piVar2 + lVar9;
        lVar9 = lVar9 + 1;
        piVar3 = (ARindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar12 = (long)*piVar1; lVar12 < piVar2[lVar9]; lVar12 = lVar12 + 1) {
          value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar3[lVar12] / (int)uVar16] = 1;
        }
      }
      std::operator<<((ostream *)&f,"1 ");
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (&f,value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar11]);
        std::operator<<(poVar7," ");
      }
      poVar7 = std::operator<<((ostream *)&f,"1 ");
      std::endl<char,std::char_traits<char>>(poVar7);
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar11] = 0;
      }
    } while ((int)uVar15 < numRow);
    while (bVar4 = uVar5 != 0, uVar5 = uVar5 - 1, bVar4) {
      std::operator<<((ostream *)&f,"1 ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&f);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&value.super__Vector_base<int,_std::allocator<int>_>);
    std::ofstream::~ofstream(&f);
    std::__cxx11::string::~string((string *)&filename);
    HVar6 = kOk;
  }
  return HVar6;
}

Assistant:

HighsStatus writeRmatrixPicToFile(const HighsOptions& options,
                                  const std::string fileprefix,
                                  const HighsInt numRow, const HighsInt numCol,
                                  const std::vector<HighsInt>& ARstart,
                                  const std::vector<HighsInt>& ARindex) {
  if (fileprefix == "") return HighsStatus::kError;
  std::string filename = fileprefix + ".pbm";
  std::ofstream f;
  f.open(filename, std::ios::out);
  const HighsInt border_width = 1;
  const HighsInt max_num_pixel_wide = 1600;
  const HighsInt max_num_pixel_deep = 900;
  const HighsInt max_num_matrix_pixel_wide =
      max_num_pixel_wide - 2 * border_width;
  const HighsInt max_num_matrix_pixel_deep =
      max_num_pixel_deep - 2 * border_width;
  HighsInt num_col_per_pixel = 1;
  HighsInt num_row_per_pixel = 1;
  if (numCol > max_num_matrix_pixel_wide) {
    num_col_per_pixel = numCol / max_num_matrix_pixel_wide;
    if (num_col_per_pixel * max_num_matrix_pixel_wide < numCol)
      num_col_per_pixel++;
  }
  if (numRow > max_num_matrix_pixel_deep) {
    num_row_per_pixel = numRow / max_num_matrix_pixel_deep;
    if (num_row_per_pixel * max_num_matrix_pixel_deep < numRow)
      num_row_per_pixel++;
  }
  const HighsInt dim_per_pixel = std::max(num_col_per_pixel, num_row_per_pixel);
  HighsInt num_pixel_wide = numCol / dim_per_pixel;
  if (dim_per_pixel * num_pixel_wide < numCol) num_pixel_wide++;
  HighsInt num_pixel_deep = numRow / dim_per_pixel;
  if (dim_per_pixel * num_pixel_deep < numRow) num_pixel_deep++;
  // Account for the borders
  num_pixel_wide += 2;
  num_pixel_deep += 2;
  assert(num_pixel_wide <= max_num_pixel_wide);
  assert(num_pixel_deep <= max_num_pixel_deep);

  highsLogUser(
      options.log_options, HighsLogType::kInfo,
      "Representing LP constraint matrix sparsity pattern %" HIGHSINT_FORMAT
      "x%" HIGHSINT_FORMAT
      " .pbm file,"
      " mapping entries in square of size %" HIGHSINT_FORMAT
      " onto one pixel\n",
      num_pixel_wide, num_pixel_deep, dim_per_pixel);

  std::vector<HighsInt> value;
  value.assign(num_pixel_wide, 0);
  f << "P1" << std::endl;
  f << num_pixel_wide << " " << num_pixel_deep << std::endl;
  HighsInt pic_num_row = 0;
  // Top border
  for (HighsInt pixel = 0; pixel < num_pixel_wide; pixel++) f << "1 ";
  f << std::endl;
  pic_num_row++;
  HighsInt from_row = 0;
  for (;;) {
    HighsInt to_row = std::min(from_row + dim_per_pixel, numRow);
    for (HighsInt iRow = from_row; iRow < to_row; iRow++) {
      for (HighsInt iEl = ARstart[iRow]; iEl < ARstart[iRow + 1]; iEl++) {
        HighsInt iCol = ARindex[iEl];
        HighsInt pixel = iCol / dim_per_pixel;
        assert(pixel < num_pixel_wide - 2);
        value[pixel] = 1;
      }
    }
    // LH border
    f << "1 ";
    for (HighsInt pixel = 0; pixel < num_pixel_wide - 2; pixel++)
      f << value[pixel] << " ";
    // LH border
    f << "1 " << std::endl;
    pic_num_row++;
    for (HighsInt pixel = 0; pixel < num_pixel_wide - 2; pixel++)
      value[pixel] = 0;
    if (to_row == numRow) break;
    from_row = to_row;
  }

  // Bottom border
  for (HighsInt pixel = 0; pixel < num_pixel_wide; pixel++) f << "1 ";
  f << std::endl;
  pic_num_row++;
  assert(pic_num_row == num_pixel_deep);

  return HighsStatus::kOk;
}